

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddTime.c
# Opt level: O3

DdNode * cuddBddAndAbstractRecurTime
                   (DdManager *manager,DdNode *f,DdNode *g,DdNode *cube,int *pRecCalls,int TimeOut)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DdNode *cube_00;
  DdNode *pDVar5;
  abctime aVar6;
  DdNode *g_00;
  uint index;
  uint *puVar7;
  DdNode *pDVar8;
  uint uVar9;
  DdHalfWord *pDVar10;
  int iVar11;
  uint *puVar12;
  uint *puVar13;
  int TimeOut_00;
  int *piVar14;
  DdNode *pDVar15;
  DdNode *local_48;
  
  pDVar5 = manager->one;
  pDVar15 = (DdNode *)((ulong)pDVar5 ^ 1);
  if (((((DdNode *)((ulong)g ^ 1) == f) || (pDVar15 == f)) || (pDVar15 == g)) ||
     (pDVar15 = pDVar5, pDVar5 == g && pDVar5 == f)) {
    return pDVar15;
  }
  TimeOut_00 = (int)pRecCalls;
  pDVar15 = (DdNode *)pRecCalls;
  if (pDVar5 != cube) {
    pDVar15 = g;
    if ((f == g || pDVar5 == f) || (pDVar15 = f, pDVar5 == g)) {
      pDVar5 = cuddBddExistAbstractRecur(manager,pDVar15,cube);
      return pDVar5;
    }
    if (g < f) {
      pDVar15 = g;
      g = f;
    }
    f = pDVar15;
    puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
    puVar12 = (uint *)((ulong)g & 0xfffffffffffffffe);
    piVar14 = manager->perm;
    uVar2 = piVar14[*puVar7];
    uVar3 = piVar14[*puVar12];
    uVar9 = uVar2;
    if (uVar3 < uVar2) {
      uVar9 = uVar3;
    }
    do {
      uVar4 = piVar14[cube->index];
      if (uVar9 <= uVar4) {
        if (((puVar7[1] != 1) || (puVar12[1] != 1)) &&
           (pDVar15 = cuddCacheLookup(manager,6,f,g,cube), pDVar15 != (DdNode *)0x0)) {
          return pDVar15;
        }
        if ((TimeOut_00 != 0) && (aVar6 = Abc_Clock(), TimeOut_00 < aVar6)) {
          return (DdNode *)0x0;
        }
        piVar14 = (int *)((ulong)pRecCalls & 0xffffffff);
        if (uVar3 < uVar2) {
          index = *puVar12;
          pDVar15 = f;
          local_48 = f;
        }
        else {
          index = *puVar7;
          pDVar15 = *(DdNode **)(puVar7 + 4);
          local_48 = *(DdNode **)(puVar7 + 6);
          if (((ulong)f & 1) != 0) {
            pDVar15 = (DdNode *)((ulong)pDVar15 ^ 1);
            local_48 = (DdNode *)((ulong)local_48 ^ 1);
          }
        }
        g_00 = g;
        pDVar8 = g;
        if (uVar3 <= uVar2) {
          pDVar8 = *(DdNode **)(puVar12 + 4);
          g_00 = *(DdNode **)(puVar12 + 6);
          if (((ulong)g & 1) != 0) {
            pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
            g_00 = (DdNode *)((ulong)g_00 ^ 1);
          }
        }
        if (uVar4 == uVar9) {
          cube_00 = (cube->type).kids.T;
          puVar13 = puVar12;
          iVar11 = TimeOut_00;
          pDVar15 = cuddBddAndAbstractRecurTime(manager,pDVar15,pDVar8,cube_00,piVar14,(int)puVar12)
          ;
          if (pDVar15 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          if (((pDVar15 != pDVar5) && (pDVar15 != local_48)) && (pDVar15 != g_00)) {
            piVar1 = (int *)(((ulong)pDVar15 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar5 = g_00;
            if ((pDVar15 == (DdNode *)((ulong)local_48 ^ 1)) ||
               (pDVar5 = local_48, pDVar15 == (DdNode *)((ulong)g_00 ^ 1))) {
              TimeOut_00 = iVar11;
              pDVar5 = cuddBddExistAbstractRecur(manager,pDVar5,cube_00);
            }
            else {
              pDVar5 = cuddBddAndAbstractRecurTime
                                 (manager,local_48,g_00,cube_00,piVar14,(int)puVar13);
            }
            if (pDVar5 == (DdNode *)0x0) goto LAB_0080ecba;
            if (pDVar15 == pDVar5) {
              pDVar10 = (DdHalfWord *)(((ulong)pDVar15 & 0xfffffffffffffffe) + 4);
            }
            else {
              piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar8 = cuddBddAndRecurTime(manager,(DdNode *)((ulong)pDVar15 ^ 1),
                                           (DdNode *)((ulong)pDVar5 ^ 1),piVar14,TimeOut_00);
              if (pDVar8 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar15);
                pDVar15 = pDVar5;
                goto LAB_0080ecba;
              }
              piVar14 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar14 = *piVar14 + 1;
              pDVar10 = (DdHalfWord *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              Cudd_DelayedDerefBdd(manager,pDVar15);
              Cudd_DelayedDerefBdd(manager,pDVar5);
              pDVar15 = (DdNode *)((ulong)pDVar8 ^ 1);
            }
            goto LAB_0080ec73;
          }
          if (puVar7[1] != 1) goto LAB_0080ec94;
          uVar2 = puVar12[1];
        }
        else {
          puVar13 = puVar12;
          pDVar15 = cuddBddAndAbstractRecurTime(manager,pDVar15,pDVar8,cube,piVar14,(int)puVar12);
          if (pDVar15 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          pDVar8 = (DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe);
          pDVar8->ref = pDVar8->ref + 1;
          pDVar5 = cuddBddAndAbstractRecurTime(manager,local_48,g_00,cube,piVar14,(int)puVar13);
          if (pDVar5 == (DdNode *)0x0) goto LAB_0080ecba;
          pDVar10 = &pDVar8->ref;
          if (pDVar15 == pDVar5) goto LAB_0080ec73;
          piVar14 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar14 = *piVar14 + 1;
          if (((ulong)pDVar15 & 1) == 0) {
            pDVar8 = cuddUniqueInter(manager,index,pDVar15,pDVar5);
            if (pDVar8 == (DdNode *)0x0) goto LAB_0080ec4a;
          }
          else {
            pDVar8 = cuddUniqueInter(manager,index,pDVar8,(DdNode *)((ulong)pDVar5 ^ 1));
            if (pDVar8 == (DdNode *)0x0) {
LAB_0080ec4a:
              Cudd_IterDerefBdd(manager,pDVar15);
              pDVar15 = pDVar5;
LAB_0080ecba:
              Cudd_IterDerefBdd(manager,pDVar15);
              return (DdNode *)0x0;
            }
            pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
          }
          piVar14 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar14 = *piVar14 + -1;
          pDVar15 = pDVar8;
LAB_0080ec73:
          *pDVar10 = *pDVar10 - 1;
          if (puVar7[1] != 1) goto LAB_0080ec94;
          uVar2 = puVar12[1];
        }
        if (uVar2 == 1) {
          return pDVar15;
        }
LAB_0080ec94:
        cuddCacheInsert(manager,6,f,g,cube,pDVar15);
        return pDVar15;
      }
      cube = (cube->type).kids.T;
      pDVar15 = g;
    } while (cube != pDVar5);
  }
  pDVar5 = cuddBddAndRecurTime(manager,f,g,(int *)((ulong)pRecCalls & 0xffffffff),(int)pDVar15);
  return pDVar5;
}

Assistant:

DdNode *
cuddBddAndAbstractRecurTime(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube,
  int * pRecCalls,
  int TimeOut)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)	return(one);

    if (cube == one) {
	return(cuddBddAndRecurTime(manager, f, g, pRecCalls, TimeOut));
    }
    if (f == one || f == g) {
	return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
	return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
	DdNode *tmp = f;
	f = g;
	g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
	cube = cuddT(cube);
	if (cube == one) {
	    return(cuddBddAndRecurTime(manager, f, g, pRecCalls, TimeOut));
	}
	topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
	r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
	if (r != NULL) {
	    return(r);
	}
    }

//    if ( TimeOut && ((*pRecCalls)++ % CHECK_FACTOR) == 0 && TimeOut < Abc_Clock() )
    if ( TimeOut && Abc_Clock() > TimeOut )
        return NULL;

    if (topf == top) {
	index = F->index;
	ft = cuddT(F);
	fe = cuddE(F);
	if (Cudd_IsComplement(f)) {
	    ft = Cudd_Not(ft);
	    fe = Cudd_Not(fe);
	}
    } else {
	index = G->index;
	ft = fe = f;
    }

    if (topg == top) {
	gt = cuddT(G);
	ge = cuddE(G);
	if (Cudd_IsComplement(g)) {
	    gt = Cudd_Not(gt);
	    ge = Cudd_Not(ge);
	}
    } else {
	gt = ge = g;
    }

    if (topcube == top) {	/* quantify */
	DdNode *Cube = cuddT(cube);
	t = cuddBddAndAbstractRecurTime(manager, ft, gt, Cube, pRecCalls, TimeOut);
	if (t == NULL) return(NULL);
	/* Special case: 1 OR anything = 1. Hence, no need to compute
	** the else branch if t is 1. Likewise t + t * anything == t.
	** Notice that t == fe implies that fe does not depend on the
	** variables in Cube. Likewise for t == ge.
	*/
	if (t == one || t == fe || t == ge) {
	    if (F->ref != 1 || G->ref != 1)
		cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
				f, g, cube, t);
	    return(t);
	}
	cuddRef(t);
	/* Special case: t + !t * anything == t + anything. */
	if (t == Cudd_Not(fe)) {
	    e = cuddBddExistAbstractRecur(manager, ge, Cube);
	} else if (t == Cudd_Not(ge)) {
	    e = cuddBddExistAbstractRecur(manager, fe, Cube);
	} else {
	    e = cuddBddAndAbstractRecurTime(manager, fe, ge, Cube, pRecCalls, TimeOut);
	}
	if (e == NULL) {
	    Cudd_IterDerefBdd(manager, t);
	    return(NULL);
	}
	if (t == e) {
	    r = t;
	    cuddDeref(t);
	} else {
	    cuddRef(e);
	    r = cuddBddAndRecurTime(manager, Cudd_Not(t), Cudd_Not(e), pRecCalls, TimeOut);
	    if (r == NULL) {
		Cudd_IterDerefBdd(manager, t);
		Cudd_IterDerefBdd(manager, e);
		return(NULL);
	    }
	    r = Cudd_Not(r);
	    cuddRef(r);
	    Cudd_DelayedDerefBdd(manager, t);
	    Cudd_DelayedDerefBdd(manager, e);
	    cuddDeref(r);
	}
    } else {
	t = cuddBddAndAbstractRecurTime(manager, ft, gt, cube, pRecCalls, TimeOut);
	if (t == NULL) return(NULL);
	cuddRef(t);
	e = cuddBddAndAbstractRecurTime(manager, fe, ge, cube, pRecCalls, TimeOut);
	if (e == NULL) {
	    Cudd_IterDerefBdd(manager, t);
	    return(NULL);
	}
	if (t == e) {
	    r = t;
	    cuddDeref(t);
	} else {
	    cuddRef(e);
	    if (Cudd_IsComplement(t)) {
		r = cuddUniqueInter(manager, (int) index,
				    Cudd_Not(t), Cudd_Not(e));
		if (r == NULL) {
		    Cudd_IterDerefBdd(manager, t);
		    Cudd_IterDerefBdd(manager, e);
		    return(NULL);
		}
		r = Cudd_Not(r);
	    } else {
		r = cuddUniqueInter(manager,(int)index,t,e);
		if (r == NULL) {
		    Cudd_IterDerefBdd(manager, t);
		    Cudd_IterDerefBdd(manager, e);
		    return(NULL);
		}
	    }
	    cuddDeref(e);
	    cuddDeref(t);
	}
    }

    if (F->ref != 1 || G->ref != 1)
	cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}